

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCompressedTexture.cpp
# Opt level: O3

void __thiscall
tcu::anon_unknown_0::decompressETC2_EAC_RGBA8
          (anon_unknown_0 *this,PixelBufferAccess *dst,deUint8 *src)

{
  int i;
  long lVar1;
  int iVar2;
  undefined1 *puVar3;
  byte *pbVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  byte *pbVar8;
  int x;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  deUint8 uncompressedBlockAlpha [16];
  deUint8 uncompressedBlockRGB [48];
  undefined1 local_68 [16];
  deUint8 local_58 [2];
  byte local_56 [46];
  
  puVar3 = local_68;
  lVar1 = 0;
  uVar11 = 0;
  do {
    uVar10 = uVar11;
    uVar11 = (ulong)src[lVar1] | uVar10 << 8;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 8);
  lVar1 = 0;
  uVar5 = 0;
  do {
    uVar5 = (ulong)src[lVar1 + 8] | uVar5 << 8;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 8);
  uVar12 = 0;
  EtcDecompressInternal::decompressETC2Block(local_58,uVar5,(deUint8 *)0x0,false);
  uVar5 = 0x2d;
  uVar7 = 0;
  do {
    iVar2 = *(int *)((long)EtcDecompressInternal::decompressEAC11Block::modifierTable[0] +
                    (ulong)((uint)((uVar11 >> (uVar5 & 0x3f) & 1) != 0) +
                            ((uint)(uVar11 >> ((char)uVar5 + 1U & 0x3f)) & 1) * 2 +
                           ((uint)(uVar11 >> ((char)uVar5 + 2U & 0x3f)) & 1) * 4) * 4 +
                    (ulong)(((ushort)(uVar10 >> 0x28) & 0xf) << 5)) *
            ((uint)(uVar10 >> 0x18) >> 0x14 & 0xf) + (uint)(byte)(uVar10 >> 0x30);
    if (0xfe < iVar2) {
      iVar2 = 0xff;
    }
    if (iVar2 < 1) {
      iVar2 = 0;
    }
    local_68[uVar7 & 0xc | uVar12 >> 2] = (char)iVar2;
    uVar5 = uVar5 - 3;
    uVar7 = uVar7 + 4;
    uVar12 = uVar12 + 1;
  } while (uVar5 != 0xfffffffffffffffd);
  iVar2 = 0;
  pbVar4 = local_56;
  lVar1 = 0;
  do {
    lVar6 = (long)iVar2;
    lVar9 = 0;
    pbVar8 = pbVar4;
    do {
      *(byte *)((long)(dst->super_ConstPixelBufferAccess).m_size.m_data + lVar9 * 4 + lVar6 + -8) =
           pbVar8[-2];
      *(byte *)((long)(dst->super_ConstPixelBufferAccess).m_size.m_data + lVar9 * 4 + lVar6 + -7) =
           pbVar8[-1];
      *(byte *)((long)(dst->super_ConstPixelBufferAccess).m_size.m_data + lVar9 * 4 + lVar6 + -6) =
           *pbVar8;
      *(undefined1 *)
       ((long)(dst->super_ConstPixelBufferAccess).m_size.m_data + lVar9 * 4 + lVar6 + -5) =
           puVar3[lVar9];
      lVar9 = lVar9 + 1;
      pbVar8 = pbVar8 + 3;
    } while (lVar9 != 4);
    lVar1 = lVar1 + 1;
    iVar2 = iVar2 + (int)this;
    pbVar4 = pbVar4 + 0xc;
    puVar3 = puVar3 + 4;
  } while (lVar1 != 4);
  return;
}

Assistant:

void decompressETC2_EAC_RGBA8 (const PixelBufferAccess& dst, const deUint8* src)
{
	using namespace EtcDecompressInternal;

	deUint8* const	dstPtr			= (deUint8*)dst.getDataPtr();
	const int		dstRowPitch		= dst.getRowPitch();
	const int		dstPixelSize	= ETC2_UNCOMPRESSED_PIXEL_SIZE_RGBA8;

	const deUint64	compressedBlockAlpha	= get128BitBlockStart(src, 0);
	const deUint64	compressedBlockRGB		= get128BitBlockEnd(src, 0);
	deUint8			uncompressedBlockAlpha[ETC2_UNCOMPRESSED_BLOCK_SIZE_A8];
	deUint8			uncompressedBlockRGB[ETC2_UNCOMPRESSED_BLOCK_SIZE_RGB8];

	// Decompress.
	decompressETC2Block(uncompressedBlockRGB, compressedBlockRGB, NULL, false);
	decompressEAC8Block(uncompressedBlockAlpha, compressedBlockAlpha);

	// Write to dst.
	for (int y = 0; y < (int)ETC2_BLOCK_HEIGHT; y++)
	{
		for (int x = 0; x < (int)ETC2_BLOCK_WIDTH; x++)
		{
			const deUint8* const	srcPixelRGB		= &uncompressedBlockRGB[(y*ETC2_BLOCK_WIDTH + x)*ETC2_UNCOMPRESSED_PIXEL_SIZE_RGB8];
			const deUint8* const	srcPixelAlpha	= &uncompressedBlockAlpha[(y*ETC2_BLOCK_WIDTH + x)*ETC2_UNCOMPRESSED_PIXEL_SIZE_A8];
			deUint8* const			dstPixel		= dstPtr + y*dstRowPitch + x*dstPixelSize;

			DE_STATIC_ASSERT(ETC2_UNCOMPRESSED_PIXEL_SIZE_RGBA8 == 4);
			dstPixel[0] = srcPixelRGB[0];
			dstPixel[1] = srcPixelRGB[1];
			dstPixel[2] = srcPixelRGB[2];
			dstPixel[3] = srcPixelAlpha[0];
		}
	}
}